

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O3

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  int *piVar9;
  char **ppcVar10;
  char *pcVar11;
  gengetopt_args_info *additional_error_00;
  gengetopt_args_info *pgVar12;
  char *pcVar13;
  uint *puVar14;
  gengetopt_args_info *extraout_RDX;
  gengetopt_args_info *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *field_given;
  uint *extraout_RDX_02;
  gengetopt_args_info *extraout_RDX_03;
  gengetopt_args_info *extraout_RDX_04;
  char *pcVar15;
  char cVar16;
  uint uVar17;
  custom_getopt_data *d;
  int iVar18;
  char **possible_values;
  option *poVar19;
  option *poVar20;
  size_t sVar21;
  int iVar22;
  ulong uVar23;
  cmdline_parser_arg_type arg_type;
  char *pcVar24;
  char short_opt;
  int local_2fc;
  uint local_2e4;
  option *local_2d0;
  gengetopt_args_info local_168;
  
  package_name = *argv;
  pcVar11 = (char *)(ulong)(uint)params->override;
  iVar4 = params->check_required;
  iVar5 = params->check_ambiguity;
  additional_error_00 = args_info;
  d = (custom_getopt_data *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
    additional_error_00 = extraout_RDX;
  }
  local_168.input_file_group_counter = 0;
  local_168.help_given = 0;
  local_168.version_given = 0;
  local_168.input_given = 0;
  local_168.xyz_given = 0;
  local_168.stl_given = 0;
  local_168.msms_given = 0;
  local_168.output_given = 0;
  local_168.model_given = 0;
  local_168.beadSize_given = 0;
  local_168.elements_given = 0;
  local_168.viscosity_given = 0;
  local_168.temperature_given = 0;
  local_168.input_arg = (char *)0x0;
  local_168.input_orig = (char *)0x0;
  local_168.xyz_arg = (char *)0x0;
  local_168.xyz_orig = (char *)0x0;
  local_168.stl_arg = (char *)0x0;
  local_168.stl_orig = (char *)0x0;
  local_168.msms_arg = (char *)0x0;
  local_168.msms_orig = (char *)0x0;
  local_168.output_arg = (char *)0x0;
  local_168.output_orig = (char *)0x0;
  local_168.model_arg = model__NULL;
  local_168.model_orig = (char *)0x0;
  local_168.beadSize_arg = 0.2;
  local_168.beadSize_orig = (char *)0x0;
  local_168.elements_flag = 0;
  local_168.viscosity_arg = 0.01;
  local_168.viscosity_orig = (char *)0x0;
  local_168.temperature_arg = 300.0;
  local_168.temperature_orig = (char *)0x0;
  local_168.help_help = gengetopt_args_info_help[0];
  local_168.version_help = gengetopt_args_info_help[1];
  local_168.input_help = gengetopt_args_info_help[3];
  local_168.xyz_help = gengetopt_args_info_help[4];
  local_168.stl_help = gengetopt_args_info_help[5];
  local_168.msms_help = gengetopt_args_info_help[6];
  local_168.output_help = gengetopt_args_info_help[7];
  local_168.model_help = gengetopt_args_info_help[8];
  local_168.beadSize_help = gengetopt_args_info_help[9];
  local_168.elements_help = gengetopt_args_info_help[10];
  local_168.viscosity_help = gengetopt_args_info_help[0xb];
  local_168.temperature_help = gengetopt_args_info_help[0xc];
  local_168.inputs = (char **)0x0;
  local_168.inputs_num = 0;
  custom_opterr = params->print_errors;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 0;
  iVar22 = 0;
  if (argc < 1) {
LAB_00121681:
    uVar17 = args_info->input_file_group_counter;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    if (1 < (int)uVar17) {
      fprintf(_stderr,"%s: %d options of group input file were given. One is required%s.\n",*argv,
              (ulong)uVar17,"");
      additional_error_00 = extraout_RDX_03;
    }
    uVar17 = (uint)(1 < (int)uVar17);
    if (iVar4 != 0) {
      iVar4 = cmdline_parser_required2(args_info,*argv,(char *)additional_error_00);
      uVar17 = uVar17 + iVar4;
    }
    cmdline_parser_release(&local_168);
    iVar4 = 1;
    if (uVar17 == 0) {
      iVar4 = 0;
      uVar17 = argc - iVar22;
      if (uVar17 != 0 && iVar22 <= argc) {
        args_info->inputs_num = uVar17;
        ppcVar10 = (char **)malloc((ulong)uVar17 * 8);
        args_info->inputs = ppcVar10;
        iVar4 = 0;
        uVar23 = 0;
        do {
          pcVar11 = gengetopt_strdup(argv[(long)iVar22 + uVar23]);
          args_info->inputs[uVar23] = pcVar11;
          uVar23 = uVar23 + 1;
        } while (uVar17 != uVar23);
      }
    }
  }
  else {
    puVar14 = &args_info->input_given;
    pcVar13 = custom_optarg;
    iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    local_2fc = custom_opterr;
LAB_00120d31:
    do {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22;
      custom_optarg = pcVar13;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
      custom_opterr = local_2fc;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
         ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_00120d99:
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        additional_error_00 =
             (gengetopt_args_info *)
             CONCAT71((int7)((ulong)puVar14 >> 8),
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
        }
        else {
          exchange(argv,d);
          additional_error_00 = extraout_RDX_00;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
          ppcVar10 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          while ((**ppcVar10 != '-' || ((*ppcVar10)[1] == '\0'))) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            ppcVar10 = ppcVar10 + 1;
            if (argc == _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              piVar9 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
              goto LAB_00121659;
            }
          }
        }
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
LAB_0012165f:
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != argc) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
          goto LAB_00121681;
        }
        lVar6 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar13 = argv[lVar6];
        if (*pcVar13 != '-') {
LAB_00121931:
          uVar23 = 1;
          custom_optarg = pcVar13;
          iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar13;
          goto switchD_0012122b_caseD_66;
        }
        cVar16 = pcVar13[1];
        additional_error_00 =
             (gengetopt_args_info *)CONCAT71((int7)((ulong)additional_error_00 >> 8),cVar16);
        if (cVar16 == '-') {
          if (pcVar13[2] == '\0') {
            iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            iVar22 = iVar5;
            if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar5;
              exchange(argv,d);
              additional_error_00 = extraout_RDX_04;
              iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar22;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar5;
            piVar9 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
LAB_00121659:
            *piVar9 = argc;
            iVar22 = argc;
            goto LAB_0012165f;
          }
        }
        else if (cVar16 == '\0') goto LAB_00121931;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar13 + (ulong)(cVar16 == '-') + 1;
      }
      else {
        if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
           (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_00120d99;
        lVar6 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      pcVar13 = argv[lVar6];
      if (pcVar13[1] == '-') {
        for (sVar21 = 0;
            (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar21] != '\0' &&
            (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar21] != '='));
            sVar21 = sVar21 + 1) {
        }
        local_2e4 = 0xffffffff;
        additional_error_00 = (gengetopt_args_info *)0x0;
        pcVar15 = "help";
        bVar1 = false;
        local_2d0 = (option *)0x0;
        poVar19 = cmdline_parser_internal::long_options;
        bVar2 = bVar1;
        poVar20 = poVar19;
        pgVar12 = additional_error_00;
        do {
          while( true ) {
            uVar17 = (uint)additional_error_00;
            iVar3 = strncmp(pcVar15,pcVar24,sVar21);
            if (iVar3 != 0) break;
            poVar19 = poVar19 + 1;
            do {
              sVar8 = strlen(pcVar15);
              uVar17 = (uint)additional_error_00;
              if ((int)sVar8 == (int)sVar21) {
                local_2d0 = poVar19 + -1;
                goto LAB_00121086;
              }
              if (local_2d0 == (option *)0x0) {
                local_2e4 = (uint)pgVar12;
                poVar19 = poVar20;
                uVar17 = local_2e4;
                local_2d0 = poVar20;
                bVar1 = bVar2;
                goto LAB_00121040;
              }
              if (((local_2d0->has_arg == poVar19[-1].has_arg) &&
                  (local_2d0->flag == poVar19[-1].flag)) && (local_2d0->val == poVar19[-1].val)) {
                poVar19 = poVar19 + -1;
                goto LAB_00121040;
              }
              pcVar15 = poVar19->name;
              if (pcVar15 == (char *)0x0) goto LAB_00121721;
              additional_error_00 = (gengetopt_args_info *)(ulong)(uVar17 + 1);
              iVar3 = strncmp(pcVar15,pcVar24,sVar21);
              poVar19 = poVar19 + 1;
              bVar1 = true;
            } while (iVar3 == 0);
            additional_error_00 = (gengetopt_args_info *)(ulong)(uVar17 + 2);
            pcVar15 = poVar19->name;
            if (pcVar15 == (char *)0x0) goto LAB_00121721;
          }
LAB_00121040:
          pcVar15 = poVar19[1].name;
          poVar19 = poVar19 + 1;
          additional_error_00 = (gengetopt_args_info *)(ulong)(uVar17 + 1);
          bVar2 = bVar1;
          poVar20 = poVar19;
          pgVar12 = additional_error_00;
        } while (pcVar15 != (char *)0x0);
        if (bVar1) {
LAB_00121721:
          if (local_2fc != 0) {
            fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar13);
            pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          sVar21 = strlen(pcVar24);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar24 + sVar21;
        }
        else {
          additional_error_00 = (gengetopt_args_info *)(ulong)local_2e4;
          if (local_2d0 != (option *)0x0) {
LAB_00121086:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
            if (pcVar24[sVar21] == '\0') {
              if (local_2d0->has_arg == 1) {
                if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                  if (local_2fc != 0) {
                    fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar13);
                    pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  }
                  goto LAB_00121878;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 2;
              }
            }
            else {
              if (local_2d0->has_arg == 0) {
                pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                if (local_2fc != 0) {
                  if (pcVar13[1] == '-') {
                    fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                            local_2d0->name);
                    pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  }
                  else {
                    fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                            (ulong)(uint)(int)*pcVar13,local_2d0->name);
                    pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  }
                }
LAB_00121878:
                sVar21 = strlen(pcVar24);
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar24 + sVar21;
                goto LAB_0012174b;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar24 + sVar21 + 1;
            }
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            short_opt = '\x1e';
            sVar21 = strlen(pcVar24);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar24 + sVar21;
            uVar23 = (ulong)(uint)local_2d0->val;
            if ((uint *)local_2d0->flag == (uint *)0x0) goto LAB_001211f5;
            *local_2d0->flag = local_2d0->val;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            goto LAB_00121280;
          }
          if (local_2fc != 0) {
            fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar24);
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
LAB_0012174b:
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        break;
      }
      pcVar13 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
      cVar16 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      uVar23 = (ulong)(uint)(int)cVar16;
      short_opt = -0x29;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar13;
      pvVar7 = memchr("hVi:x:o:s:ev:t:",(int)cVar16,0x10);
      if (pcVar24[1] == '\0') {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if ((pvVar7 == (void *)0x0) || (cVar16 == ':')) {
        if (local_2fc != 0) {
          fprintf(_stderr,"%s: invalid option -- %c\n",*argv,uVar23);
        }
        goto LAB_0012174b;
      }
      additional_error_00 = (gengetopt_args_info *)0x0;
      if (*(char *)((long)pvVar7 + 1) == ':') {
        if (*(char *)((long)pvVar7 + 2) == ':') {
          if (*pcVar13 == '\0') {
            pcVar13 = (char *)0x0;
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          additional_error_00 = (gengetopt_args_info *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar13;
        }
        else {
          if (*pcVar13 == '\0') {
            if (iVar22 == argc) {
              cVar16 = '?';
              if (local_2fc != 0) {
                short_opt = -0x40;
                fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,uVar23);
                iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              }
            }
            else {
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = argv[iVar22];
              iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            }
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar13;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          additional_error_00 = (gengetopt_args_info *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          uVar23 = (ulong)(uint)(int)cVar16;
        }
      }
LAB_001211f5:
      pcVar13 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      local_2fc = custom_opterr;
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      iVar18 = (int)uVar23;
      iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (iVar18 < 0x56) {
        if (iVar18 != 0) {
          if (iVar18 == -1) goto LAB_00121681;
          if (iVar18 != 0x3f) {
switchD_0012122b_caseD_66:
            do {
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar3;
              cmdline_parser_internal();
switchD_0012122b_default:
              iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            } while ((int)uVar23 != 0x56);
            cmdline_parser_print_version();
LAB_00121969:
            cmdline_parser_free(&local_168);
            exit(0);
          }
          break;
        }
LAB_00121280:
        pcVar13 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        local_2fc = custom_opterr;
        pcVar24 = cmdline_parser_internal::long_options[(int)additional_error_00].name;
        short_opt = -0x5f;
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        iVar3 = strcmp(pcVar24,"stl");
        if (iVar3 != 0) {
          short_opt = -0x4c;
          iVar3 = strcmp(pcVar24,"msms");
          if (iVar3 == 0) {
            iVar3 = args_info->input_file_group_counter;
            if (iVar3 != 0 && (int)pcVar11 != 0) {
              short_opt = -0x68;
              reset_group_input_file(args_info);
              iVar3 = args_info->input_file_group_counter;
            }
            args_info->input_file_group_counter = iVar3 + 1;
            pcVar24 = (char *)0x2d;
            iVar3 = 0x1fb05e;
            puVar14 = &local_168.msms_given;
            field_given = &args_info->msms_given;
            d = (custom_getopt_data *)&args_info->msms_orig;
            ppcVar10 = &args_info->msms_arg;
            goto LAB_001215db;
          }
          d = (custom_getopt_data *)0x1fac7b;
          short_opt = -0x2f;
          iVar3 = strcmp(pcVar24,"model");
          puVar14 = extraout_RDX_01;
          if (iVar3 == 0) {
            possible_values = cmdline_parser_model_values;
            pcVar24 = (char *)0x2d;
            iVar3 = 0x1fac7b;
            iVar18 = 0;
            arg_type = ARG_ENUM;
            puVar14 = &local_168.model_given;
            field_given = &args_info->model_given;
            d = (custom_getopt_data *)&args_info->model_orig;
            ppcVar10 = (char **)&args_info->model_arg;
            goto LAB_001215e8;
          }
          goto LAB_00120d31;
        }
        iVar3 = args_info->input_file_group_counter;
        if (iVar3 != 0 && (int)pcVar11 != 0) {
          short_opt = '9';
          reset_group_input_file(args_info);
          iVar3 = args_info->input_file_group_counter;
        }
        args_info->input_file_group_counter = iVar3 + 1;
        pcVar24 = (char *)0x2d;
        iVar3 = 0x1fa214;
        puVar14 = &local_168.stl_given;
        field_given = &args_info->stl_given;
        d = (custom_getopt_data *)&args_info->stl_orig;
        ppcVar10 = &args_info->stl_arg;
      }
      else {
        switch(iVar18) {
        case 0x65:
          d = (custom_getopt_data *)0x0;
          possible_values = (char **)0x0;
          pcVar24 = (char *)0x65;
          iVar3 = 0x1fb073;
          iVar18 = 1;
          arg_type = ARG_FLAG;
          puVar14 = &local_168.elements_given;
          field_given = &args_info->elements_given;
          ppcVar10 = (char **)&args_info->elements_flag;
          goto LAB_001215e8;
        case 0x66:
        case 0x67:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x75:
        case 0x77:
          goto switchD_0012122b_caseD_66;
        case 0x68:
          cmdline_parser_print_help();
          goto LAB_00121969;
        case 0x69:
          iVar3 = args_info->input_file_group_counter;
          if (iVar3 != 0 && (int)pcVar11 != 0) {
            short_opt = ',';
            reset_group_input_file(args_info);
            iVar3 = args_info->input_file_group_counter;
          }
          args_info->input_file_group_counter = iVar3 + 1;
          pcVar24 = (char *)0x69;
          iVar3 = 0x1fb058;
          puVar14 = &local_168.input_given;
          field_given = &args_info->input_given;
          d = (custom_getopt_data *)&args_info->input_orig;
          ppcVar10 = &args_info->input_arg;
          break;
        case 0x6f:
          pcVar24 = (char *)0x6f;
          iVar3 = 0x1fb063;
          puVar14 = &local_168.output_given;
          field_given = &args_info->output_given;
          d = (custom_getopt_data *)&args_info->output_orig;
          ppcVar10 = &args_info->output_arg;
          break;
        case 0x73:
          pcVar24 = (char *)0x73;
          iVar3 = 0x1fb06a;
          pcVar15 = "0.2";
          puVar14 = &local_168.beadSize_given;
          field_given = &args_info->beadSize_given;
          d = (custom_getopt_data *)&args_info->beadSize_orig;
          ppcVar10 = (char **)&args_info->beadSize_arg;
          goto LAB_00121504;
        case 0x74:
          pcVar24 = (char *)0x74;
          iVar3 = 0x1fb086;
          pcVar15 = "300";
          puVar14 = &local_168.temperature_given;
          field_given = &args_info->temperature_given;
          d = (custom_getopt_data *)&args_info->temperature_orig;
          ppcVar10 = (char **)&args_info->temperature_arg;
          goto LAB_00121504;
        case 0x76:
          pcVar24 = (char *)0x76;
          iVar3 = 0x1fb07c;
          pcVar15 = "0.01";
          puVar14 = &local_168.viscosity_given;
          field_given = &args_info->viscosity_given;
          d = (custom_getopt_data *)&args_info->viscosity_orig;
          ppcVar10 = (char **)&args_info->viscosity_arg;
LAB_00121504:
          iVar18 = 0;
          arg_type = ARG_DOUBLE;
          possible_values = (char **)0x0;
          goto LAB_001215ea;
        case 0x78:
          iVar3 = args_info->input_file_group_counter;
          if (iVar3 != 0 && (int)pcVar11 != 0) {
            short_opt = ',';
            reset_group_input_file(args_info);
            iVar3 = args_info->input_file_group_counter;
          }
          args_info->input_file_group_counter = iVar3 + 1;
          pcVar24 = (char *)0x78;
          iVar3 = 0x1fa219;
          puVar14 = &local_168.xyz_given;
          field_given = &args_info->xyz_given;
          d = (custom_getopt_data *)&args_info->xyz_orig;
          ppcVar10 = &args_info->xyz_arg;
          break;
        default:
          goto switchD_0012122b_default;
        }
      }
LAB_001215db:
      possible_values = (char **)0x0;
      iVar18 = 0;
      arg_type = ARG_STRING;
LAB_001215e8:
      pcVar15 = (char *)0x0;
LAB_001215ea:
      iVar3 = update_arg(ppcVar10,(char **)d,field_given,puVar14,pcVar13,possible_values,pcVar15,
                         arg_type,iVar5,(int)pcVar11,iVar18,iVar3,pcVar24,short_opt,pcVar11);
      puVar14 = extraout_RDX_02;
    } while (iVar3 == 0);
    cmdline_parser_release(&local_168);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "xyz",	1, NULL, 'x' },
        { "stl",	1, NULL, 0 },
        { "msms",	1, NULL, 0 },
        { "output",	1, NULL, 'o' },
        { "model",	1, NULL, 0 },
        { "beadSize",	1, NULL, 's' },
        { "elements",	0, NULL, 'e' },
        { "viscosity",	1, NULL, 'v' },
        { "temperature",	1, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:x:o:s:ev:t:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input MetaData (omd) file.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* xyz file for AtomicBead model.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->xyz_arg), 
               &(args_info->xyz_orig), &(args_info->xyz_given),
              &(local_args_info.xyz_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "xyz", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file prefix.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 's':	/* bead size (diameter) for RoughShell model (in angstroms).  */
        
        
          if (update_arg( (void *)&(args_info->beadSize_arg), 
               &(args_info->beadSize_orig), &(args_info->beadSize_given),
              &(local_args_info.beadSize_given), optarg, 0, "0.2", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "beadSize", 's',
              additional_error))
            goto failure;
        
          break;
        case 'e':	/* output the hydrodynamic elements (beads or triangles) only, hydrodynamics calculation will not be performed.  */
        
        
          if (update_arg((void *)&(args_info->elements_flag), 0, &(args_info->elements_given),
              &(local_args_info.elements_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "elements", 'e',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* viscosity (in poise).  */
        
        
          if (update_arg( (void *)&(args_info->viscosity_arg), 
               &(args_info->viscosity_orig), &(args_info->viscosity_given),
              &(local_args_info.viscosity_given), optarg, 0, "0.01", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "viscosity", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* temperature (in Kelvin.  */
        
        
          if (update_arg( (void *)&(args_info->temperature_arg), 
               &(args_info->temperature_orig), &(args_info->temperature_given),
              &(local_args_info.temperature_given), optarg, 0, "300", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "temperature", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* stl file for BoundaryElement model.  */
          if (strcmp (long_options[option_index].name, "stl") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->stl_arg), 
                 &(args_info->stl_orig), &(args_info->stl_given),
                &(local_args_info.stl_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "stl", '-',
                additional_error))
              goto failure;
          
          }
          /* filename root for MSMS .vert and .face files.  */
          else if (strcmp (long_options[option_index].name, "msms") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->msms_arg), 
                 &(args_info->msms_orig), &(args_info->msms_given),
                &(local_args_info.msms_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "msms", '-',
                additional_error))
              goto failure;
          
          }
          /* hydrodynamics model.  */
          else if (strcmp (long_options[option_index].name, "model") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->model_arg), 
                 &(args_info->model_orig), &(args_info->model_given),
                &(local_args_info.model_given), optarg, cmdline_parser_model_values, 0, ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "model", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->input_file_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group input file were given. One is required%s.\n", argv[0], args_info->input_file_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}